

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_options.cpp
# Opt level: O2

string * __thiscall
RandomizerOptions::goal_abi_cxx11_(string *__return_storage_ptr__,RandomizerOptions *this)

{
  const_reference ppcVar1;
  allocator<char> local_9;
  
  ppcVar1 = std::array<const_char_*,_3UL>::at(&GOALS_TABLE,(ulong)this->_goal);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,*ppcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string RandomizerOptions::goal() const
{
    return GOALS_TABLE.at(_goal);
}